

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

bool __thiscall State::AddOut(State *this,Edge *edge,StringPiece path,uint64_t slash_bits)

{
  pointer *pppNVar1;
  Edge *pEVar2;
  iterator __position;
  Node *node;
  Node *local_20;
  
  local_20 = GetNode(this,path,slash_bits);
  pEVar2 = local_20->in_edge_;
  if (pEVar2 == (Edge *)0x0) {
    __position._M_current =
         (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&edge->outputs_,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      pppNVar1 = &(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    local_20->in_edge_ = edge;
  }
  return pEVar2 == (Edge *)0x0;
}

Assistant:

bool State::AddOut(Edge* edge, StringPiece path, uint64_t slash_bits) {
  Node* node = GetNode(path, slash_bits);
  if (node->in_edge())
    return false;
  edge->outputs_.push_back(node);
  node->set_in_edge(edge);
  return true;
}